

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

int nni_sock_add_dialer(nni_sock *s,nni_dialer *d)

{
  long lVar1;
  nni_ep_option *o;
  uint64_t val;
  int i;
  int rv;
  nni_dialer *d_local;
  nni_sock *s_local;
  
  _i = d;
  d_local = (nni_dialer *)s;
  s_local._4_4_ = nni_dialer_hold(d);
  if (s_local._4_4_ == 0) {
    val._0_4_ = 0;
    val._4_4_ = 0;
    while (ep_options[(int)val].eo_name != (char *)0x0) {
      lVar1 = (long)(int)val;
      val._4_4_ = nni_sock_getopt((nni_sock *)d_local,ep_options[lVar1].eo_name,&o,(size_t *)0x0,
                                  ep_options[lVar1].eo_type);
      if (val._4_4_ == 0) {
        val._4_4_ = nni_dialer_setopt(_i,ep_options[lVar1].eo_name,&o,0,ep_options[lVar1].eo_type);
      }
      if ((val._4_4_ != 0) && (val._4_4_ != 9)) {
        nni_dialer_rele(_i);
        return val._4_4_;
      }
      val._0_4_ = (int)val + 1;
    }
    nni_mtx_lock((nni_mtx *)&(d_local->d_ops).d_fini);
    if (((ulong)(d_local->d_con_aio).a_inputs[0] & 1) == 0) {
      nni_list_append((nni_list *)&(d_local->d_con_aio).a_iov[4].iov_len,_i);
      nni_stat_inc((nni_stat_item *)(d_local->d_tmo_aio).a_iov,1);
      nni_mtx_unlock((nni_mtx *)&(d_local->d_ops).d_fini);
      s_local._4_4_ = 0;
    }
    else {
      nni_mtx_unlock((nni_mtx *)&(d_local->d_ops).d_fini);
      nni_dialer_rele(_i);
      s_local._4_4_ = 7;
    }
  }
  return s_local._4_4_;
}

Assistant:

int
nni_sock_add_dialer(nni_sock *s, nni_dialer *d)
{
	int rv;

	// grab a hold on the dialer for the socket
	if ((rv = nni_dialer_hold(d)) != 0) {
		return (rv);
	}
	// copy initial values for some options from socket
	for (int i = 0; ep_options[i].eo_name != NULL; i++) {
		uint64_t             val; // big enough
		const nni_ep_option *o = &ep_options[i];
		rv = nni_sock_getopt(s, o->eo_name, &val, NULL, o->eo_type);
		if (rv == 0) {
			rv = nni_dialer_setopt(
			    d, o->eo_name, &val, 0, o->eo_type);
		}
		if (rv != 0 && rv != NNG_ENOTSUP) {
			nni_dialer_rele(d);
			return (rv);
		}
	}

	nni_mtx_lock(&s->s_mx);
	if (s->s_closing) {
		nni_mtx_unlock(&s->s_mx);
		nni_dialer_rele(d);
		return (NNG_ECLOSED);
	}

	nni_list_append(&s->s_dialers, d);

#ifdef NNG_ENABLE_STATS
	nni_stat_inc(&s->st_dialers, 1);
#endif

	nni_mtx_unlock(&s->s_mx);
	return (0);
}